

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::ProfiledNewScArray
              (uint32 elementCount,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  bool bVar1;
  ThreadContext *pTVar2;
  bool bVar3;
  JavascriptNativeArray *this;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  if (((arrayInfo->field_0).bits & 1) == 0) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase);
    if (!bVar3) {
      this = &JavascriptLibrary::CreateNativeIntArrayLiteral
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,elementCount)->
              super_JavascriptNativeArray;
      JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
      goto LAB_00b7b4d1;
    }
  }
  if (((arrayInfo->field_0).bits & 2) == 0) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase);
    if (!bVar3) {
      this = &JavascriptLibrary::CreateNativeFloatArrayLiteral
                        ((scriptContext->super_ScriptContextBase).javascriptLibrary,elementCount)->
              super_JavascriptNativeArray;
      JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
      goto LAB_00b7b4d1;
    }
  }
  this = (JavascriptNativeArray *)
         JavascriptLibrary::CreateArrayLiteral
                   ((scriptContext->super_ScriptContextBase).javascriptLibrary,elementCount);
LAB_00b7b4d1:
  pTVar2->noJsReentrancy = bVar1;
  return this;
}

Assistant:

Var JavascriptArray::ProfiledNewScArray(uint32 elementCount, ScriptContext *scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScArray, reentrancylock, scriptContext->GetThreadContext());
        if (arrayInfo->IsNativeIntArray())
        {
            JavascriptNativeIntArray *arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(elementCount);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        if (arrayInfo->IsNativeFloatArray())
        {
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(elementCount);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(elementCount);
        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScArray);
    }